

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

size_t __thiscall caffe::EmbedParameter::ByteSizeLong(EmbedParameter *this)

{
  void *pvVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  uint uVar5;
  size_t sVar6;
  
  pvVar1 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) == 0) {
    sVar6 = 0;
  }
  else {
    sVar6 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize
                      ((UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  uVar3 = (this->_has_bits_).has_bits_[0];
  if ((uVar3 & 0x1f) != 0) {
    if ((uVar3 & 1) != 0) {
      sVar4 = FillerParameter::ByteSizeLong(this->weight_filler_);
      uVar3 = (uint)sVar4 | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar6 = sVar6 + sVar4 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
      uVar3 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar3 & 2) != 0) {
      sVar4 = FillerParameter::ByteSizeLong(this->bias_filler_);
      uVar3 = (uint)sVar4 | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar6 = sVar6 + sVar4 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
      uVar3 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar3 & 4) != 0) {
      uVar5 = this->num_output_ | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar6 = sVar6 + (iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar3 & 8) != 0) {
      uVar5 = this->input_dim_ | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar6 = sVar6 + (iVar2 * 9 + 0x49U >> 6) + 1;
    }
    sVar6 = sVar6 + (uVar3 >> 3 & 2);
  }
  this->_cached_size_ = (int)sVar6;
  return sVar6;
}

Assistant:

size_t EmbedParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.EmbedParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  if (_has_bits_[0 / 32] & 31u) {
    // optional .caffe.FillerParameter weight_filler = 4;
    if (has_weight_filler()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->weight_filler_);
    }

    // optional .caffe.FillerParameter bias_filler = 5;
    if (has_bias_filler()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->bias_filler_);
    }

    // optional uint32 num_output = 1;
    if (has_num_output()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->num_output());
    }

    // optional uint32 input_dim = 2;
    if (has_input_dim()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->input_dim());
    }

    // optional bool bias_term = 3 [default = true];
    if (has_bias_term()) {
      total_size += 1 + 1;
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}